

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_false>_>,_3,_0,_0>
     ::run(Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
           *dst,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>_>
                *src)

{
  long start;
  double *pdVar1;
  double dVar2;
  PointerType pdVar3;
  ulong end;
  double dVar4;
  Index index;
  ulong end_00;
  
  pdVar3 = (dst->
           super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
           .m_data;
  end = (dst->
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_Eigen::Dense>
        ).
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
        .m_rows.m_value;
  end_00 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
  if ((long)end <= (long)end_00) {
    end_00 = end;
  }
  if (((ulong)pdVar3 & 7) != 0) {
    end_00 = end;
  }
  start = end_00 + ((long)(end - end_00) / 2) * 2;
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,1,false>const>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>,_1,1,true>>
            (src,dst,0,end_00);
  for (; (long)end_00 < start; end_00 = end_00 + 2) {
    pdVar1 = (src->m_xpr).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
             .m_data + end_00;
    dVar4 = pdVar1[1];
    dVar2 = (src->m_functor).m_other;
    pdVar3 = (dst->
             super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
             .m_data + end_00;
    *pdVar3 = dVar2 * *pdVar1;
    pdVar3[1] = dVar2 * dVar4;
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,1,false>const>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>,_1,1,true>>
            (src,dst,start,end);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }